

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O2

void __thiscall CSocekt::flyd_close_listening_sockets(CSocekt *this)

{
  self *psVar1;
  LogStream *this_00;
  long lVar2;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_1028 [12];
  undefined1 local_1018 [12];
  Logger local_1008;
  
  for (lVar2 = 0; lVar2 < this->m_ListenPortCount; lVar2 = lVar2 + 1) {
    if (muduo::g_logLevel < 2) {
      muduo::Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_1018,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                );
      file._12_4_ = 0;
      file.data_ = (char *)local_1018._0_8_;
      file.size_ = local_1018._8_4_;
      muduo::Logger::Logger(&local_1008,file,0x140,DEBUG,"flyd_close_listening_sockets");
      psVar1 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_18858);
      this_00 = muduo::LogStream::operator<<
                          (psVar1,(this->m_ListenSocketList).
                                  super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar2]->port);
      psVar1 = muduo::LogStream::operator<<(this_00,anon_var_dwarf_1886f);
      muduo::LogStream::operator<<
                (psVar1,(this->m_ListenSocketList).
                        super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar2]->fd);
      muduo::Logger::~Logger(&local_1008);
    }
    close((this->m_ListenSocketList).
          super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar2]->fd);
    if (muduo::g_logLevel < 3) {
      muduo::Logger::SourceFile::SourceFile<100>
                ((SourceFile *)local_1028,
                 (char (*) [100])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket.cc"
                );
      file_00._12_4_ = 0;
      file_00.data_ = (char *)local_1028._0_8_;
      file_00.size_ = local_1028._8_4_;
      muduo::Logger::Logger(&local_1008,file_00,0x142);
      psVar1 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_18886);
      muduo::LogStream::operator<<
                (psVar1,(this->m_ListenSocketList).
                        super__Vector_base<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar2]->port);
      muduo::Logger::~Logger(&local_1008);
    }
  }
  return;
}

Assistant:

void CSocekt::flyd_close_listening_sockets()
{
    for(int i = 0; i < m_ListenPortCount; i++) //要关闭这么多个监听端口
    {
        //ngx_log_stderr(0,"端口是%d,socketid是%d.",m_ListenSocketList[i]->port,m_ListenSocketList[i]->fd);
        LOG_DEBUG << "端口是 " << m_ListenSocketList[i]->port << "socketid是" << m_ListenSocketList[i]->fd;
        close(m_ListenSocketList[i]->fd);
        LOG_INFO << "关闭监听端口" << m_ListenSocketList[i]->port;
        //ngx_log_error_core(NGX_LOG_INFO,0,"关闭监听端口%d!",m_ListenSocketList[i]->port); //显示一些信息到日志中
    }//end for(int i = 0; i < m_ListenPortCount; i++)
}